

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallExportGenerator::GenerateScriptActions
          (cmInstallExportGenerator *this,ostream *os,Indent indent)

{
  undefined8 os_00;
  ostream *poVar1;
  pointer this_00;
  char *permissions_file;
  undefined1 local_120 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_e0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  cmScriptGeneratorIndent local_a8;
  cmScriptGeneratorIndent local_a4;
  Indent indentNNN;
  Indent indentNN;
  Indent indentN;
  string installedFile;
  char local_61;
  string local_60;
  undefined1 local_40 [8];
  string installedDir;
  ostream *os_local;
  cmInstallExportGenerator *this_local;
  Indent indent_local;
  
  installedDir.field_2._8_8_ = os;
  this_local._4_4_ = indent.Level;
  cmInstallGenerator::ConvertToAbsoluteDestination
            (&local_60,&(this->super_cmInstallGenerator).Destination);
  local_61 = '/';
  cmStrCat<char_const(&)[14],std::__cxx11::string,char>
            ((string *)local_40,(char (*) [14])"$ENV{DESTDIR}",&local_60,&local_61);
  std::__cxx11::string::~string((string *)&local_60);
  cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&>
            ((string *)&indentN,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             &this->FileName);
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)this_local._4_4_);
  poVar1 = std::operator<<(poVar1,"if(EXISTS \"");
  poVar1 = std::operator<<(poVar1,(string *)&indentN);
  std::operator<<(poVar1,"\")\n");
  indentNNN.Level =
       (int)cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
  local_a4 = cmScriptGeneratorIndent::Next(&indentNNN,2);
  local_a8 = cmScriptGeneratorIndent::Next(&local_a4,2);
  local_ac = indentNNN.Level;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)indentNNN.Level);
  poVar1 = std::operator<<(poVar1,"file(DIFFERENT _cmake_export_file_changed FILES\n");
  local_b0 = indentNNN.Level;
  poVar1 = ::operator<<(poVar1,(cmScriptGeneratorIndent)indentNNN.Level);
  poVar1 = std::operator<<(poVar1,"     \"");
  poVar1 = std::operator<<(poVar1,(string *)&indentN);
  poVar1 = std::operator<<(poVar1,"\"\n");
  local_b4 = indentNNN.Level;
  poVar1 = ::operator<<(poVar1,(cmScriptGeneratorIndent)indentNNN.Level);
  poVar1 = std::operator<<(poVar1,"     \"");
  poVar1 = std::operator<<(poVar1,(string *)&this->MainImportFile);
  std::operator<<(poVar1,"\")\n");
  local_b8 = indentNNN.Level;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)indentNNN.Level);
  std::operator<<(poVar1,"if(_cmake_export_file_changed)\n");
  local_bc = local_a4.Level;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_a4);
  poVar1 = std::operator<<(poVar1,"file(GLOB _cmake_old_config_files \"");
  poVar1 = std::operator<<(poVar1,(string *)local_40);
  this_00 = std::
            unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
            ::operator->(&this->EFGen);
  cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_(&local_e0,this_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_e0);
  std::operator<<(poVar1,"\")\n");
  std::__cxx11::string::~string((string *)&local_e0);
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_a4);
  std::operator<<(poVar1,"if(_cmake_old_config_files)\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_a8);
  std::operator<<(poVar1,
                  "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n"
                 );
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_a8);
  poVar1 = std::operator<<(poVar1,"message(STATUS \"Old export file \\\"");
  poVar1 = std::operator<<(poVar1,(string *)&indentN);
  std::operator<<(poVar1,
                  "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_a8);
  std::operator<<(poVar1,"unset(_cmake_old_config_files_text)\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_a8);
  std::operator<<(poVar1,"file(REMOVE ${_cmake_old_config_files})\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_a4);
  std::operator<<(poVar1,"endif()\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_a4);
  std::operator<<(poVar1,"unset(_cmake_old_config_files)\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)indentNNN.Level);
  std::operator<<(poVar1,"endif()\n");
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = indentNNN.Level;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)indentNNN.Level);
  std::operator<<(poVar1,"unset(_cmake_export_file_changed)\n");
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = this_local._4_4_;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)this_local._4_4_);
  std::operator<<(poVar1,"endif()\n");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_120);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_120,&this->MainImportFile);
  os_00 = installedDir.field_2._8_8_;
  permissions_file = (char *)std::__cxx11::string::c_str();
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,(ostream *)os_00,
             &(this->super_cmInstallGenerator).Destination,cmInstallType_FILES,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_120,false,permissions_file,(char *)0x0,(char *)0x0,(char *)0x0,
             this_local._4_4_,(char *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  std::__cxx11::string::~string((string *)&indentN);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScriptActions(std::ostream& os,
                                                     Indent indent)
{
  // Remove old per-configuration export files if the main changes.
  std::string installedDir = cmStrCat(
    "$ENV{DESTDIR}", ConvertToAbsoluteDestination(this->Destination), '/');
  std::string installedFile = cmStrCat(installedDir, this->FileName);
  os << indent << "if(EXISTS \"" << installedFile << "\")\n";
  Indent indentN = indent.Next();
  Indent indentNN = indentN.Next();
  Indent indentNNN = indentNN.Next();
  /* clang-format off */
  os << indentN << "file(DIFFERENT _cmake_export_file_changed FILES\n"
     << indentN << "     \"" << installedFile << "\"\n"
     << indentN << "     \"" << this->MainImportFile << "\")\n";
  os << indentN << "if(_cmake_export_file_changed)\n";
  os << indentNN << "file(GLOB _cmake_old_config_files \"" << installedDir
     << this->EFGen->GetConfigImportFileGlob() << "\")\n";
  os << indentNN << "if(_cmake_old_config_files)\n";
  os << indentNNN << "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n";
  os << indentNNN << R"(message(STATUS "Old export file \")" << installedFile
     << "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n";
  os << indentNNN << "unset(_cmake_old_config_files_text)\n";
  os << indentNNN << "file(REMOVE ${_cmake_old_config_files})\n";
  os << indentNN << "endif()\n";
  os << indentNN << "unset(_cmake_old_config_files)\n";
  os << indentN << "endif()\n";
  os << indentN << "unset(_cmake_export_file_changed)\n";
  os << indent << "endif()\n";
  /* clang-format on */

  // Install the main export file.
  std::vector<std::string> files;
  files.push_back(this->MainImportFile);
  this->AddInstallRule(os, this->Destination, cmInstallType_FILES, files,
                       false, this->FilePermissions.c_str(), nullptr, nullptr,
                       nullptr, indent);
}